

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

EnumValueDescriptorProto *
google::protobuf::descriptor_unittest::AddEnumValue
          (EnumDescriptorProto *enum_proto,string *name,int number)

{
  EnumValueDescriptorProto *pEVar1;
  Arena *arena;
  
  pEVar1 = (EnumValueDescriptorProto *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(enum_proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::EnumValueDescriptorProto>);
  *(byte *)&pEVar1->field_0 = *(byte *)&pEVar1->field_0 | 1;
  arena = (Arena *)(pEVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set<>(&(pEVar1->field_0)._impl_.name_,name,arena);
  (pEVar1->field_0)._impl_.number_ = number;
  *(byte *)&pEVar1->field_0 = *(byte *)&pEVar1->field_0 | 4;
  return pEVar1;
}

Assistant:

EnumValueDescriptorProto* AddEnumValue(EnumDescriptorProto* enum_proto,
                                       const std::string& name, int number) {
  EnumValueDescriptorProto* result = enum_proto->add_value();
  result->set_name(name);
  result->set_number(number);
  return result;
}